

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O1

int ecx_getindex(ecx_portt *port)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  pthread_mutex_lock((pthread_mutex_t *)&port->getindex_mutex);
  iVar3 = port->lastidx + 1;
  if (0xe < port->lastidx) {
    iVar3 = 0;
  }
  lVar1 = (long)iVar3;
  if (port->rxbufstat[lVar1] != 0) {
    uVar2 = 0;
    do {
      bVar4 = 0xe < iVar3;
      iVar3 = iVar3 + 1;
      if (bVar4) {
        iVar3 = 0;
      }
      lVar1 = (long)iVar3;
    } while ((port->rxbufstat[lVar1] != 0) && (bVar4 = uVar2 < 0xf, uVar2 = uVar2 + 1, bVar4));
  }
  port->rxbufstat[lVar1] = 1;
  if (port->redstate != 0) {
    port->redport->rxbufstat[lVar1] = 1;
  }
  port->lastidx = iVar3;
  pthread_mutex_unlock((pthread_mutex_t *)&port->getindex_mutex);
  return iVar3;
}

Assistant:

int ecx_getindex(ecx_portt *port)
{
   int idx;
   int cnt;
#ifdef RTNET
   rt_mutex_acquire(&port->getindex_mutex, TM_INFINITE);
#else
   pthread_mutex_lock( &(port->getindex_mutex) );
#endif //RTNET

   idx = port->lastidx + 1;
   /* index can't be larger than buffer array */
   if (idx >= EC_MAXBUF) 
   {
      idx = 0;
   }
   cnt = 0;
   /* try to find unused index */
   while ((port->rxbufstat[idx] != EC_BUF_EMPTY) && (cnt < EC_MAXBUF))
   {
      idx++;
      cnt++;
      if (idx >= EC_MAXBUF) 
      {
         idx = 0;
      }
   }
   port->rxbufstat[idx] = EC_BUF_ALLOC;
   if (port->redstate != ECT_RED_NONE)
      port->redport->rxbufstat[idx] = EC_BUF_ALLOC;
   port->lastidx = idx;
#ifdef RTNET
   rt_mutex_release(&port->getindex_mutex);
#else
   pthread_mutex_unlock( &(port->getindex_mutex) );
#endif
   return idx;
}